

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-id.c++
# Opt level: O0

void __thiscall
capnp::compiler::TypeIdGenerator::update
          (TypeIdGenerator *this,ArrayPtr<const_unsigned_char> dataArray)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  ulong __n;
  unsigned_long free;
  unsigned_long used;
  ulong uStack_50;
  uint saved_lo;
  unsigned_long size;
  byte *data;
  Fault local_30;
  Fault f;
  DebugExpression<bool> _kjCondition;
  TypeIdGenerator *this_local;
  ArrayPtr<const_unsigned_char> dataArray_local;
  
  dataArray_local.ptr = (uchar *)dataArray.size_;
  this_local = (TypeIdGenerator *)dataArray.ptr;
  f.exception._6_1_ = (this->finished ^ 0xffU) & 1;
  f.exception._7_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 6));
  bVar2 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f.exception + 7))
  ;
  if (!bVar2) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[41]>
              (&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/type-id.c++"
               ,0x158,FAILED,"!finished","_kjCondition,\"already called TypeIdGenerator::finish()\""
               ,(DebugExpression<bool> *)((long)&f.exception + 7),
               (char (*) [41])"already called TypeIdGenerator::finish()");
    kj::_::Debug::Fault::fatal(&local_30);
  }
  size = (unsigned_long)
         kj::ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)&this_local);
  uStack_50 = kj::ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&this_local);
  uVar1 = (this->ctx).lo;
  uVar3 = uVar1 + (int)uStack_50 & 0x1fffffff;
  (this->ctx).lo = uVar3;
  if (uVar3 < uVar1) {
    (this->ctx).hi = (this->ctx).hi + 1;
  }
  (this->ctx).hi = (this->ctx).hi + (int)(uStack_50 >> 0x1d);
  uVar4 = (ulong)(uVar1 & 0x3f);
  if (uVar4 != 0) {
    __n = 0x40 - uVar4;
    if (uStack_50 < __n) {
      memcpy((this->ctx).buffer + uVar4,(void *)size,uStack_50);
      return;
    }
    memcpy((this->ctx).buffer + uVar4,(void *)size,__n);
    size = size + __n;
    uStack_50 = uStack_50 - __n;
    body(this,(this->ctx).buffer,0x40);
  }
  if (0x3f < uStack_50) {
    size = (unsigned_long)body(this,(byte *)size,uStack_50 & 0xffffffffffffffc0);
    uStack_50 = uStack_50 & 0x3f;
  }
  memcpy((this->ctx).buffer,(void *)size,uStack_50);
  return;
}

Assistant:

void TypeIdGenerator::update(kj::ArrayPtr<const kj::byte> dataArray)
{
  KJ_REQUIRE(!finished, "already called TypeIdGenerator::finish()");

  const kj::byte* data = dataArray.begin();
  unsigned long size = dataArray.size();

  uint saved_lo;
  unsigned long used, free;

  saved_lo = ctx.lo;
  if ((ctx.lo = (saved_lo + size) & 0x1fffffff) < saved_lo)
    ctx.hi++;
  ctx.hi += size >> 29;

  used = saved_lo & 0x3f;

  if (used) {
    free = 64 - used;

    if (size < free) {
      memcpy(&ctx.buffer[used], data, size);
      return;
    }

    memcpy(&ctx.buffer[used], data, free);
    data = data + free;
    size -= free;
    body(ctx.buffer, 64);
  }

  if (size >= 64) {
    data = body(data, size & ~(unsigned long)0x3f);
    size &= 0x3f;
  }

  memcpy(ctx.buffer, data, size);
}